

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O2

Value * __thiscall camp::TagHolder::tag(TagHolder *this,Value *id)

{
  const_iterator cVar1;
  undefined1 *puVar2;
  
  cVar1 = std::
          _Rb_tree<camp::Value,_std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>,_std::_Select1st<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
          ::find(&(this->m_tags)._M_t,id);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_tags)._M_t._M_impl.super__Rb_tree_header) {
    puVar2 = Value::nothing;
  }
  else {
    puVar2 = (undefined1 *)&cVar1._M_node[3]._M_parent;
  }
  return (Value *)puVar2;
}

Assistant:

const Value& TagHolder::tag(const Value& id) const
{
    TagsTable::const_iterator it = m_tags.find(id);
    if (it != m_tags.end())
        return it->second.get();

    return Value::nothing;
}